

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O3

void * lj_alloc_malloc(void *msp,size_t nsize)

{
  ulong *puVar1;
  byte *pbVar2;
  int iVar3;
  void *pvVar4;
  undefined1 (*pauVar5) [16];
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int *piVar9;
  void *pvVar10;
  undefined1 (*pauVar11) [16];
  ulong uVar12;
  long lVar13;
  size_t dvs;
  long lVar14;
  undefined1 (*pauVar15) [16];
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong *puVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  undefined8 *puVar25;
  long *plVar26;
  byte bVar27;
  ulong uVar28;
  long lVar29;
  undefined8 *puVar30;
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  if (nsize < 0xf1) {
    uVar16 = 0x20;
    if (0x16 < nsize) {
      uVar16 = (ulong)((int)nsize + 0xfU & 0x1f8);
    }
    uVar17 = *msp;
    bVar27 = (byte)(uVar16 >> 3);
    uVar18 = uVar17 >> (bVar27 & 0x1f);
    if ((uVar18 & 3) != 0) {
      uVar18 = (~uVar18 & 1) + (int)(uVar16 >> 3);
      lVar14 = (long)msp + (ulong)(uVar18 * 0x10) + 0x38;
      lVar13 = *(long *)((long)msp + (ulong)(uVar18 * 0x10) + 0x48);
      lVar24 = *(long *)(lVar13 + 0x10);
      if (lVar14 == lVar24) {
        *(uint *)msp = uVar17 & ~(1 << (uVar18 & 0x1f));
      }
      else {
        *(long *)((long)msp + (ulong)(uVar18 * 0x10) + 0x48) = lVar24;
        *(long *)(lVar24 + 0x18) = lVar14;
      }
      *(ulong *)(lVar13 + 8) = (ulong)(uVar18 * 8) + 3;
      pbVar2 = (byte *)(lVar13 + 8 + (ulong)(uVar18 * 8));
      *pbVar2 = *pbVar2 | 1;
      return (void *)(lVar13 + 0x10);
    }
    uVar12 = *(ulong *)((long)msp + 8);
    if (uVar12 < uVar16) {
      if (uVar17 >> (bVar27 & 0x1f) != 0) {
        uVar23 = 2 << (bVar27 & 0x1f);
        uVar23 = (-uVar23 | uVar23) & uVar18 << (bVar27 & 0x1f);
        uVar18 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
          }
        }
        uVar23 = uVar18 << 4;
        lVar14 = (long)msp + (ulong)uVar23 + 0x38;
        lVar13 = *(long *)((long)msp + (ulong)uVar23 + 0x48);
        lVar24 = *(long *)(lVar13 + 0x10);
        if (lVar14 == lVar24) {
          uVar17 = uVar17 & ~(1 << (uVar18 & 0x1f));
          *(uint *)msp = uVar17;
        }
        else {
          *(long *)((long)msp + (ulong)uVar23 + 0x48) = lVar24;
          *(long *)(lVar24 + 0x18) = lVar14;
        }
        uVar28 = (ulong)(uVar18 * 8);
        uVar21 = uVar28 - uVar16;
        if (0x1f < uVar21) {
          *(ulong *)(lVar13 + 8) = uVar16 | 3;
          *(ulong *)(lVar13 + 8 + uVar16) = uVar21 | 1;
          *(ulong *)(lVar13 + uVar28) = uVar21;
          if (uVar12 != 0) {
            lVar24 = *(long *)((long)msp + 0x18);
            uVar12 = uVar12 >> 3;
            lVar14 = (long)msp + uVar12 * 0x10 + 0x38;
            if ((uVar17 >> ((uint)uVar12 & 0x1f) & 1) == 0) {
              *(uint *)msp = uVar17 | 1 << ((byte)uVar12 & 0x1f);
              lVar29 = lVar14;
            }
            else {
              lVar29 = *(long *)(lVar14 + 0x10);
            }
            *(long *)(lVar14 + 0x10) = lVar24;
            *(long *)(lVar29 + 0x18) = lVar24;
            *(long *)(lVar24 + 0x10) = lVar29;
            *(long *)(lVar24 + 0x18) = lVar14;
          }
          *(ulong *)((long)msp + 8) = uVar21;
          *(ulong *)((long)msp + 0x18) = lVar13 + uVar16;
          return (void *)(lVar13 + 0x10);
        }
        *(ulong *)(lVar13 + 8) = uVar28 | 3;
        pbVar2 = (byte *)(lVar13 + 8 + uVar28);
        *pbVar2 = *pbVar2 | 1;
        return (void *)(lVar13 + 0x10);
      }
      uVar18 = *(uint *)((long)msp + 4);
      if (uVar18 != 0) {
        uVar23 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
          }
        }
        lVar13 = *(long *)((long)msp + (ulong)uVar23 * 8 + 0x248);
        uVar21 = (*(ulong *)(lVar13 + 8) & 0xfffffffffffffffc) - uVar16;
        lVar24 = lVar13;
        while ((lVar14 = *(long *)(lVar13 + 0x20), lVar14 != 0 ||
               (lVar14 = *(long *)(lVar13 + 0x28), lVar14 != 0))) {
          uVar28 = (*(ulong *)(lVar14 + 8) & 0xfffffffffffffffc) - uVar16;
          lVar13 = lVar14;
          if (uVar28 < uVar21) {
            uVar21 = uVar28;
            lVar24 = lVar14;
          }
        }
        lVar13 = *(long *)(lVar24 + 0x18);
        lVar14 = *(long *)(lVar24 + 0x30);
        if (lVar13 == lVar24) {
          if (*(long *)(lVar24 + 0x28) == 0) {
            if (*(long *)(lVar24 + 0x20) == 0) {
              lVar13 = 0;
              goto LAB_001422c6;
            }
            lVar29 = *(long *)(lVar24 + 0x20);
            puVar25 = (undefined8 *)(lVar24 + 0x20);
          }
          else {
            lVar29 = *(long *)(lVar24 + 0x28);
            puVar25 = (undefined8 *)(lVar24 + 0x28);
          }
          do {
            do {
              puVar30 = puVar25;
              lVar13 = lVar29;
              lVar29 = *(long *)(lVar13 + 0x28);
              puVar25 = (undefined8 *)(lVar13 + 0x28);
            } while (*(long *)(lVar13 + 0x28) != 0);
            lVar29 = *(long *)(lVar13 + 0x20);
            puVar25 = (undefined8 *)(lVar13 + 0x20);
          } while (*(long *)(lVar13 + 0x20) != 0);
          *puVar30 = 0;
        }
        else {
          lVar29 = *(long *)(lVar24 + 0x10);
          *(long *)(lVar29 + 0x18) = lVar13;
          *(long *)(lVar13 + 0x10) = lVar29;
        }
LAB_001422c6:
        if (lVar14 != 0) {
          lVar29 = *(long *)(lVar24 + 0x38);
          if (lVar24 == *(long *)((long)msp + lVar29 * 8 + 0x248)) {
            *(long *)((long)msp + lVar29 * 8 + 0x248) = lVar13;
            if (lVar13 != 0) goto LAB_001422fb;
            *(uint *)((long)msp + 4) = uVar18 & ~(1 << ((uint)lVar29 & 0x1f));
          }
          else {
            *(long *)(lVar14 + 0x20 + (ulong)(*(long *)(lVar14 + 0x20) != lVar24) * 8) = lVar13;
            if (lVar13 != 0) {
LAB_001422fb:
              *(long *)(lVar13 + 0x30) = lVar14;
              lVar14 = *(long *)(lVar24 + 0x20);
              if (lVar14 != 0) {
                *(long *)(lVar13 + 0x20) = lVar14;
                *(long *)(lVar14 + 0x30) = lVar13;
              }
              lVar14 = *(long *)(lVar24 + 0x28);
              if (lVar14 != 0) {
                *(long *)(lVar13 + 0x28) = lVar14;
                *(long *)(lVar14 + 0x30) = lVar13;
              }
            }
          }
        }
        if (uVar21 < 0x20) {
          *(ulong *)(lVar24 + 8) = uVar21 + uVar16 | 3;
          pbVar2 = (byte *)(lVar24 + 8 + uVar21 + uVar16);
          *pbVar2 = *pbVar2 | 1;
        }
        else {
          *(ulong *)(lVar24 + 8) = uVar16 | 3;
          *(ulong *)(lVar24 + 8 + uVar16) = uVar21 | 1;
          *(ulong *)(lVar24 + uVar16 + uVar21) = uVar21;
          if (uVar12 != 0) {
            lVar13 = *(long *)((long)msp + 0x18);
            uVar12 = uVar12 >> 3;
            lVar14 = (long)msp + uVar12 * 0x10 + 0x38;
            if ((uVar17 >> ((uint)uVar12 & 0x1f) & 1) == 0) {
              *(uint *)msp = 1 << ((byte)uVar12 & 0x1f) | uVar17;
              lVar29 = lVar14;
            }
            else {
              lVar29 = *(long *)((long)msp + uVar12 * 0x10 + 0x48);
            }
            *(long *)((long)msp + uVar12 * 0x10 + 0x48) = lVar13;
            *(long *)(lVar29 + 0x18) = lVar13;
            *(long *)(lVar13 + 0x10) = lVar29;
            *(long *)(lVar13 + 0x18) = lVar14;
          }
          *(ulong *)((long)msp + 8) = uVar21;
          *(ulong *)((long)msp + 0x18) = lVar24 + uVar16;
        }
        goto LAB_00141b16;
      }
    }
  }
  else {
    uVar16 = 0xffffffffffffffff;
    if (nsize < 0xffffffffffffff80) {
      uVar16 = nsize + 0xf & 0xfffffffffffffff8;
      uVar17 = *(uint *)((long)msp + 4);
      if (uVar17 != 0) {
        uVar18 = (uint)(nsize + 0xf >> 8);
        if (uVar18 == 0) {
          uVar12 = 0;
        }
        else {
          uVar12 = 0x1f;
          if (uVar18 < 0x10000) {
            uVar23 = 0x1f;
            if (uVar18 != 0) {
              for (; uVar18 >> uVar23 == 0; uVar23 = uVar23 - 1) {
              }
            }
            uVar12 = (ulong)((uVar16 >> ((ulong)(byte)(0x26 - (char)(uVar23 ^ 0x1f)) & 0x3f) & 1) !=
                            0) | (ulong)((uVar23 ^ 0x1f) * 2 ^ 0x3e);
          }
        }
        uVar21 = -uVar16;
        lVar13 = *(long *)((long)msp + uVar12 * 8 + 0x248);
        if (lVar13 == 0) {
          lVar14 = 0;
          lVar24 = 0;
        }
        else {
          bVar27 = 0x39 - (char)(uVar12 >> 1);
          if (uVar12 == 0x1f) {
            bVar27 = 0;
          }
          lVar29 = uVar16 << (bVar27 & 0x3f);
          lVar14 = 0;
          lVar24 = 0;
          do {
            uVar28 = (*(ulong *)(lVar13 + 8) & 0xfffffffffffffffc) - uVar16;
            if ((uVar28 < uVar21) && (uVar21 = uVar28, lVar24 = lVar13, uVar28 == 0)) {
              uVar21 = 0;
              goto LAB_001419a7;
            }
            lVar22 = *(long *)(lVar13 + 0x28);
            lVar13 = *(long *)(lVar13 + 0x20 + (lVar29 >> 0x3f) * -8);
            lVar31 = lVar22;
            if (lVar22 == lVar13) {
              lVar31 = lVar14;
            }
            if (lVar22 != 0) {
              lVar14 = lVar31;
            }
            lVar29 = lVar29 * 2;
          } while (lVar13 != 0);
        }
        if (lVar14 == 0 && lVar24 == 0) {
          uVar18 = 2 << ((byte)uVar12 & 0x1f);
          uVar18 = (-uVar18 | uVar18) & uVar17;
          if (uVar18 == 0) goto LAB_00141a08;
          uVar23 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
            }
          }
          lVar24 = 0;
          lVar14 = *(long *)((long)msp + (ulong)uVar23 * 8 + 0x248);
        }
        while (lVar13 = lVar14, lVar13 != 0) {
LAB_001419a7:
          uVar28 = (*(ulong *)(lVar13 + 8) & 0xfffffffffffffffc) - uVar16;
          uVar12 = uVar28;
          if (uVar21 <= uVar28) {
            uVar12 = uVar21;
          }
          if (uVar21 > uVar28) {
            lVar24 = lVar13;
          }
          uVar21 = uVar12;
          lVar14 = *(long *)(lVar13 + 0x20);
          if (*(long *)(lVar13 + 0x20) == 0) {
            lVar14 = *(long *)(lVar13 + 0x28);
          }
        }
        if ((lVar24 != 0) && (uVar21 < *(long *)((long)msp + 8) - uVar16)) {
          lVar13 = *(long *)(lVar24 + 0x18);
          lVar14 = *(long *)(lVar24 + 0x30);
          if (lVar13 == lVar24) {
            if (*(long *)(lVar24 + 0x28) == 0) {
              if (*(long *)(lVar24 + 0x20) == 0) {
                lVar13 = 0;
                goto LAB_00141f92;
              }
              lVar29 = *(long *)(lVar24 + 0x20);
              puVar25 = (undefined8 *)(lVar24 + 0x20);
            }
            else {
              lVar29 = *(long *)(lVar24 + 0x28);
              puVar25 = (undefined8 *)(lVar24 + 0x28);
            }
            do {
              do {
                puVar30 = puVar25;
                lVar13 = lVar29;
                lVar29 = *(long *)(lVar13 + 0x28);
                puVar25 = (undefined8 *)(lVar13 + 0x28);
              } while (*(long *)(lVar13 + 0x28) != 0);
              lVar29 = *(long *)(lVar13 + 0x20);
              puVar25 = (undefined8 *)(lVar13 + 0x20);
            } while (*(long *)(lVar13 + 0x20) != 0);
            *puVar30 = 0;
          }
          else {
            lVar29 = *(long *)(lVar24 + 0x10);
            *(long *)(lVar29 + 0x18) = lVar13;
            *(long *)(lVar13 + 0x10) = lVar29;
          }
LAB_00141f92:
          if (lVar14 != 0) {
            lVar29 = *(long *)(lVar24 + 0x38);
            if (lVar24 == *(long *)((long)msp + lVar29 * 8 + 0x248)) {
              *(long *)((long)msp + lVar29 * 8 + 0x248) = lVar13;
              if (lVar13 != 0) goto LAB_00141fcb;
              *(uint *)((long)msp + 4) = uVar17 & ~(1 << ((uint)lVar29 & 0x1f));
            }
            else {
              *(long *)(lVar14 + 0x20 + (ulong)(*(long *)(lVar14 + 0x20) != lVar24) * 8) = lVar13;
              if (lVar13 != 0) {
LAB_00141fcb:
                *(long *)(lVar13 + 0x30) = lVar14;
                lVar14 = *(long *)(lVar24 + 0x20);
                if (lVar14 != 0) {
                  *(long *)(lVar13 + 0x20) = lVar14;
                  *(long *)(lVar14 + 0x30) = lVar13;
                }
                lVar14 = *(long *)(lVar24 + 0x28);
                if (lVar14 != 0) {
                  *(long *)(lVar13 + 0x28) = lVar14;
                  *(long *)(lVar14 + 0x30) = lVar13;
                }
              }
            }
          }
          if (uVar21 < 0x20) {
            *(ulong *)(lVar24 + 8) = uVar21 + uVar16 | 3;
            pbVar2 = (byte *)(lVar24 + 8 + uVar21 + uVar16);
            *pbVar2 = *pbVar2 | 1;
          }
          else {
            lVar13 = lVar24 + uVar16;
            *(ulong *)(lVar24 + 8) = uVar16 | 3;
            *(ulong *)(lVar24 + 8 + uVar16) = uVar21 | 1;
            *(ulong *)(lVar13 + uVar21) = uVar21;
            if (uVar21 < 0x100) {
              uVar21 = uVar21 >> 3;
              lVar14 = (long)msp + uVar21 * 0x10 + 0x38;
              if ((*msp >> ((uint)uVar21 & 0x1f) & 1) == 0) {
                *(uint *)msp = *msp | 1 << ((byte)uVar21 & 0x1f);
                lVar29 = lVar14;
              }
              else {
                lVar29 = *(long *)((long)msp + uVar21 * 0x10 + 0x48);
              }
              *(long *)((long)msp + uVar21 * 0x10 + 0x48) = lVar13;
              *(long *)(lVar29 + 0x18) = lVar13;
              *(long *)(lVar13 + 0x10) = lVar29;
              *(long *)(lVar13 + 0x18) = lVar14;
            }
            else {
              uVar17 = (uint)(uVar21 >> 8);
              if (uVar17 == 0) {
                uVar16 = 0;
              }
              else {
                uVar16 = 0x1f;
                if (uVar17 < 0x10000) {
                  uVar18 = 0x1f;
                  if (uVar17 != 0) {
                    for (; uVar17 >> uVar18 == 0; uVar18 = uVar18 - 1) {
                    }
                  }
                  uVar16 = (ulong)((uint)((uVar21 >> ((ulong)(byte)(0x26 - (char)(uVar18 ^ 0x1f)) &
                                                     0x3f) & 1) != 0) | (uVar18 ^ 0x1f) * 2 ^ 0x3e);
                }
              }
              plVar26 = (long *)((long)msp + uVar16 * 8 + 0x248);
              *(ulong *)(lVar13 + 0x38) = uVar16;
              *(undefined1 (*) [16])(lVar13 + 0x20) = (undefined1  [16])0x0;
              if ((*(uint *)((long)msp + 4) >> ((uint)uVar16 & 0x1f) & 1) == 0) {
                *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar16 & 0x1f);
                *plVar26 = lVar13;
                *(long **)(lVar13 + 0x30) = plVar26;
              }
              else {
                bVar27 = 0x39 - (char)(uVar16 >> 1);
                if (uVar16 == 0x1f) {
                  bVar27 = 0;
                }
                lVar29 = uVar21 << (bVar27 & 0x3f);
                lVar14 = *plVar26;
                do {
                  lVar22 = lVar14;
                  if ((*(ulong *)(lVar22 + 8) & 0xfffffffffffffffc) == uVar21) {
                    lVar14 = *(long *)(lVar22 + 0x10);
                    *(long *)(lVar14 + 0x18) = lVar13;
                    *(long *)(lVar22 + 0x10) = lVar13;
                    *(long *)(lVar13 + 0x10) = lVar14;
                    *(long *)(lVar13 + 0x18) = lVar22;
                    *(undefined8 *)(lVar13 + 0x30) = 0;
                    goto LAB_00141b16;
                  }
                  lVar31 = lVar29 >> 0x3f;
                  lVar29 = lVar29 * 2;
                  lVar14 = *(long *)(lVar22 + 0x20 + lVar31 * -8);
                } while (lVar14 != 0);
                *(long *)(lVar22 + 0x20 + lVar31 * -8) = lVar13;
                *(long *)(lVar13 + 0x30) = lVar22;
              }
              *(long *)(lVar13 + 0x18) = lVar13;
              *(long *)(lVar13 + 0x10) = lVar13;
            }
          }
          goto LAB_00141b16;
        }
      }
    }
  }
LAB_00141a08:
  uVar12 = *(ulong *)((long)msp + 8);
  uVar21 = uVar12 - uVar16;
  if (uVar16 <= uVar12) {
    lVar24 = *(long *)((long)msp + 0x18);
    if (uVar21 < 0x20) {
      *(ulong *)(lVar24 + 8) = uVar12 | 3;
      pbVar2 = (byte *)(lVar24 + 8 + uVar12);
      *pbVar2 = *pbVar2 | 1;
      lVar13 = 0;
      uVar21 = 0;
    }
    else {
      lVar13 = lVar24 + uVar16;
      *(ulong *)(lVar24 + 8 + uVar16) = uVar21 | 1;
      *(ulong *)(lVar24 + uVar12) = uVar21;
      *(ulong *)(lVar24 + 8) = uVar16 | 3;
    }
    *(long *)((long)msp + 0x18) = lVar13;
    *(ulong *)((long)msp + 8) = uVar21;
    goto LAB_00141b16;
  }
  uVar12 = *(ulong *)((long)msp + 0x10) - uVar16;
  if (*(ulong *)((long)msp + 0x10) < uVar16 || uVar12 == 0) {
    if ((0x1ffff < uVar16) && (pvVar10 = direct_alloc(uVar16), pvVar10 != (void *)0x0)) {
      return pvVar10;
    }
    uVar12 = uVar16 + 0x20040 & 0xfffffffffffe0000;
    if (uVar12 <= uVar16) {
      return (void *)0x0;
    }
    piVar9 = __errno_location();
    iVar3 = *piVar9;
    pvVar10 = mmap64((void *)0x0,uVar12,3,0x62,-1,0);
    *piVar9 = iVar3;
    if (pvVar10 == (void *)0xffffffffffffffff) {
      return (void *)0x0;
    }
    puVar1 = (ulong *)((long)msp + 0x348);
    puVar19 = puVar1;
    do {
      if (pvVar10 == (void *)((long)*puVar19 + puVar19[1])) {
        pvVar4 = *(void **)((long)msp + 0x20);
        if (((void *)*puVar19 <= pvVar4) && (pvVar4 < pvVar10)) {
          puVar19[1] = puVar19[1] + uVar12;
          lVar13 = uVar12 + *(long *)((long)msp + 0x10);
          uVar12 = (ulong)(-(int)pvVar4 - 0x10U & 7);
          uVar21 = lVar13 - uVar12;
          *(ulong *)((long)msp + 0x20) = (long)pvVar4 + uVar12;
          *(ulong *)((long)msp + 0x10) = uVar21;
          *(ulong *)((long)pvVar4 + uVar12 + 8) = uVar21 | 1;
          *(undefined8 *)((long)pvVar4 + lVar13 + 8) = 0x40;
          *(undefined8 *)((long)msp + 0x28) = 0x200000;
          goto LAB_00142279;
        }
        break;
      }
      puVar19 = (ulong *)puVar19[2];
    } while (puVar19 != (ulong *)0x0);
    puVar19 = puVar1;
    while( true ) {
      uVar21 = *puVar19;
      if (uVar21 == (long)pvVar10 + uVar12) break;
      puVar19 = (ulong *)puVar19[2];
      if (puVar19 == (ulong *)0x0) goto code_r0x00141b98;
    }
    *puVar19 = (ulong)pvVar10;
    puVar19[1] = puVar19[1] + uVar12;
    uVar28 = (ulong)(-(int)pvVar10 - 0x10U & 7);
    lVar24 = (-(int)uVar21 - 0x10U & 7) + uVar21;
    lVar13 = (long)pvVar10 + uVar16 + uVar28;
    uVar12 = lVar24 - lVar13;
    *(ulong *)((long)pvVar10 + uVar28 + 8) = uVar16 | 3;
    if (lVar24 == *(long *)((long)msp + 0x20)) {
      uVar12 = uVar12 + *(long *)((long)msp + 0x10);
      *(ulong *)((long)msp + 0x10) = uVar12;
      *(long *)((long)msp + 0x20) = lVar13;
      *(ulong *)(lVar13 + 8) = uVar12 | 1;
      goto LAB_001425fb;
    }
    if (lVar24 == *(long *)((long)msp + 0x18)) {
      uVar12 = uVar12 + *(long *)((long)msp + 8);
      *(ulong *)((long)msp + 8) = uVar12;
      *(long *)((long)msp + 0x18) = lVar13;
      *(ulong *)(lVar13 + 8) = uVar12 | 1;
      *(ulong *)(lVar13 + uVar12) = uVar12;
      goto LAB_001425fb;
    }
    uVar16 = *(ulong *)(lVar24 + 8);
    if ((uVar16 & 2) != 0) goto LAB_001424a0;
    uVar21 = uVar16 & 0xfffffffffffffffc;
    lVar14 = *(long *)(lVar24 + 0x18);
    if (uVar16 < 0x100) {
      lVar29 = *(long *)(lVar24 + 0x10);
      if (lVar29 == lVar14) {
        bVar27 = (byte)(uVar16 >> 3) & 0x1f;
        *(uint *)msp = *msp & (-2 << bVar27 | 0xfffffffeU >> 0x20 - bVar27);
      }
      else {
        *(long *)(lVar29 + 0x18) = lVar14;
        *(long *)(lVar14 + 0x10) = lVar29;
      }
      goto LAB_00142495;
    }
    lVar29 = *(long *)(lVar24 + 0x30);
    if (lVar14 != lVar24) {
      lVar22 = *(long *)(lVar24 + 0x10);
      *(long *)(lVar22 + 0x18) = lVar14;
      *(long *)(lVar14 + 0x10) = lVar22;
      goto LAB_0014242b;
    }
    if (*(long *)(lVar24 + 0x28) != 0) {
      lVar22 = *(long *)(lVar24 + 0x28);
      puVar25 = (undefined8 *)(lVar24 + 0x28);
      goto LAB_00142404;
    }
    if (*(long *)(lVar24 + 0x20) == 0) {
      lVar14 = 0;
    }
    else {
      lVar22 = *(long *)(lVar24 + 0x20);
      puVar25 = (undefined8 *)(lVar24 + 0x20);
LAB_00142404:
      do {
        do {
          puVar30 = puVar25;
          lVar14 = lVar22;
          lVar22 = *(long *)(lVar14 + 0x28);
          puVar25 = (undefined8 *)(lVar14 + 0x28);
        } while (*(long *)(lVar14 + 0x28) != 0);
        lVar22 = *(long *)(lVar14 + 0x20);
        puVar25 = (undefined8 *)(lVar14 + 0x20);
      } while (*(long *)(lVar14 + 0x20) != 0);
      *puVar30 = 0;
    }
LAB_0014242b:
    if (lVar29 != 0) {
      lVar22 = *(long *)(lVar24 + 0x38);
      if (lVar24 == *(long *)((long)msp + lVar22 * 8 + 0x248)) {
        *(long *)((long)msp + lVar22 * 8 + 0x248) = lVar14;
        if (lVar14 == 0) {
          bVar27 = (byte)lVar22 & 0x1f;
          *(uint *)((long)msp + 4) =
               *(uint *)((long)msp + 4) & (-2 << bVar27 | 0xfffffffeU >> 0x20 - bVar27);
          goto LAB_00142495;
        }
      }
      else {
        *(long *)(lVar29 + 0x20 + (ulong)(*(long *)(lVar29 + 0x20) != lVar24) * 8) = lVar14;
        if (lVar14 == 0) goto LAB_00142495;
      }
      *(long *)(lVar14 + 0x30) = lVar29;
      lVar29 = *(long *)(lVar24 + 0x20);
      if (lVar29 != 0) {
        *(long *)(lVar14 + 0x20) = lVar29;
        *(long *)(lVar29 + 0x30) = lVar14;
      }
      lVar29 = *(long *)(lVar24 + 0x28);
      if (lVar29 != 0) {
        *(long *)(lVar14 + 0x28) = lVar29;
        *(long *)(lVar29 + 0x30) = lVar14;
      }
    }
LAB_00142495:
    uVar16 = *(ulong *)(lVar24 + 8 + uVar21);
    lVar24 = lVar24 + uVar21;
    uVar12 = uVar12 + uVar21;
LAB_001424a0:
    *(ulong *)(lVar24 + 8) = uVar16 & 0xfffffffffffffffe;
    *(ulong *)(lVar13 + 8) = uVar12 | 1;
    *(ulong *)(lVar13 + uVar12) = uVar12;
    if (uVar12 < 0x100) {
      uVar12 = uVar12 >> 3;
      lVar24 = (long)msp + uVar12 * 0x10 + 0x38;
      if ((*msp >> ((uint)uVar12 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << ((byte)uVar12 & 0x1f);
        lVar14 = lVar24;
      }
      else {
        lVar14 = *(long *)((long)msp + uVar12 * 0x10 + 0x48);
      }
      *(long *)((long)msp + uVar12 * 0x10 + 0x48) = lVar13;
      *(long *)(lVar14 + 0x18) = lVar13;
      *(long *)(lVar13 + 0x10) = lVar14;
      *(long *)(lVar13 + 0x18) = lVar24;
    }
    else {
      uVar17 = (uint)(uVar12 >> 8);
      if (uVar17 == 0) {
        uVar16 = 0;
      }
      else {
        uVar16 = 0x1f;
        if (uVar17 < 0x10000) {
          uVar18 = 0x1f;
          if (uVar17 != 0) {
            for (; uVar17 >> uVar18 == 0; uVar18 = uVar18 - 1) {
            }
          }
          uVar16 = (ulong)((uint)((uVar12 >> ((ulong)(byte)(0x26 - (char)(uVar18 ^ 0x1f)) & 0x3f) &
                                  1) != 0) | (uVar18 ^ 0x1f) * 2 ^ 0x3e);
        }
      }
      plVar26 = (long *)((long)msp + uVar16 * 8 + 0x248);
      *(ulong *)(lVar13 + 0x38) = uVar16;
      *(undefined1 (*) [16])(lVar13 + 0x20) = (undefined1  [16])0x0;
      if ((*(uint *)((long)msp + 4) >> ((uint)uVar16 & 0x1f) & 1) == 0) {
        *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar16 & 0x1f);
        *plVar26 = lVar13;
        *(long **)(lVar13 + 0x30) = plVar26;
      }
      else {
        bVar27 = 0x39 - (char)(uVar16 >> 1);
        if (uVar16 == 0x1f) {
          bVar27 = 0;
        }
        lVar14 = uVar12 << (bVar27 & 0x3f);
        lVar24 = *plVar26;
        do {
          lVar29 = lVar24;
          if ((*(ulong *)(lVar29 + 8) & 0xfffffffffffffffc) == uVar12) {
            lVar24 = *(long *)(lVar29 + 0x10);
            *(long *)(lVar24 + 0x18) = lVar13;
            *(long *)(lVar29 + 0x10) = lVar13;
            *(long *)(lVar13 + 0x10) = lVar24;
            *(long *)(lVar13 + 0x18) = lVar29;
            *(undefined8 *)(lVar13 + 0x30) = 0;
            goto LAB_001425fb;
          }
          lVar22 = lVar14 >> 0x3f;
          lVar14 = lVar14 * 2;
          lVar24 = *(long *)(lVar29 + 0x20 + lVar22 * -8);
        } while (lVar24 != 0);
        *(long *)(lVar29 + 0x20 + lVar22 * -8) = lVar13;
        *(long *)(lVar13 + 0x30) = lVar29;
      }
      *(long *)(lVar13 + 0x18) = lVar13;
      *(long *)(lVar13 + 0x10) = lVar13;
    }
LAB_001425fb:
    return (void *)((long)pvVar10 + uVar28 + 0x10);
  }
  goto LAB_00141a1d;
code_r0x00141b98:
  pauVar5 = *(undefined1 (**) [16])((long)msp + 0x20);
  for (puVar19 = puVar1;
      (pauVar5 < (undefined1 (*) [16])*puVar19 ||
      (pauVar20 = (undefined1 (*) [16])(*(undefined1 (*) [16])*puVar19 + puVar19[1]),
      pauVar20 <= pauVar5)); puVar19 = (ulong *)puVar19[2]) {
  }
  pauVar15 = (undefined1 (*) [16])(pauVar20[-5] + (ulong)(0x37U - (int)pauVar20 & 7) + 9);
  if ((undefined1 (*) [16])(pauVar20[-5] + (ulong)(0x37U - (int)pauVar20 & 7) + 9) < pauVar5 + 2) {
    pauVar15 = pauVar5;
  }
  uVar28 = (ulong)(-(int)pvVar10 - 0x10U & 7);
  uVar21 = (uVar12 - 0x40) - uVar28;
  *(ulong *)((long)msp + 0x20) = (long)pvVar10 + uVar28;
  *(ulong *)((long)msp + 0x10) = uVar21;
  *(ulong *)((long)pvVar10 + uVar28 + 8) = uVar21 | 1;
  *(undefined8 *)((long)pvVar10 + (uVar12 - 0x38)) = 0x40;
  *(undefined8 *)((long)msp + 0x28) = 0x200000;
  *(undefined8 *)(*pauVar15 + 8) = 0x23;
  uVar6 = *(undefined8 *)((long)msp + 0x350);
  *(ulong *)pauVar15[1] = *puVar1;
  *(undefined8 *)(pauVar15[1] + 8) = uVar6;
  *(undefined8 *)pauVar15[2] = *(undefined8 *)((long)msp + 0x358);
  *(void **)((long)msp + 0x348) = pvVar10;
  *(ulong *)((long)msp + 0x350) = uVar12;
  *(undefined1 (**) [16])((long)msp + 0x358) = pauVar15 + 1;
  auVar8 = _DAT_00157430;
  auVar7 = _DAT_00157420;
  pauVar11 = pauVar15 + 3;
  if (pauVar15 + 3 < pauVar20) {
    pauVar11 = pauVar20;
  }
  uVar12 = (long)pauVar11 + (-0x29 - (long)pauVar15);
  auVar34._8_4_ = (int)uVar12;
  auVar34._0_8_ = uVar12;
  auVar34._12_4_ = (int)(uVar12 >> 0x20);
  auVar32._0_8_ = uVar12 >> 3;
  auVar32._8_8_ = auVar34._8_8_ >> 3;
  uVar21 = 0;
  auVar32 = auVar32 ^ _DAT_00157430;
  do {
    auVar33._8_4_ = (int)uVar21;
    auVar33._0_8_ = uVar21;
    auVar33._12_4_ = (int)(uVar21 >> 0x20);
    auVar34 = (auVar33 | auVar7) ^ auVar8;
    if ((bool)(~(auVar34._4_4_ == auVar32._4_4_ && auVar32._0_4_ < auVar34._0_4_ ||
                auVar32._4_4_ < auVar34._4_4_) & 1)) {
      *(undefined8 *)(pauVar15[2] + uVar21 * 8 + 8) = 0xb;
    }
    if ((auVar34._12_4_ != auVar32._12_4_ || auVar34._8_4_ <= auVar32._8_4_) &&
        auVar34._12_4_ <= auVar32._12_4_) {
      *(undefined8 *)(pauVar15[3] + uVar21 * 8) = 0xb;
    }
    uVar21 = uVar21 + 2;
  } while (((uVar12 >> 3) + 2 & 0xfffffffffffffffe) != uVar21);
  uVar12 = (long)pauVar15 - (long)pauVar5;
  if (uVar12 != 0) {
    (*pauVar15)[8] = (*pauVar15)[8] & 0xfe;
    *(ulong *)(*pauVar5 + 8) = uVar12 | 1;
    *(ulong *)*pauVar15 = uVar12;
    if (uVar12 < 0x100) {
      uVar12 = uVar12 >> 3;
      pauVar20 = (undefined1 (*) [16])((long)msp + uVar12 * 0x10 + 0x38);
      if ((*msp >> ((uint)uVar12 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << ((byte)uVar12 & 0x1f);
        pauVar15 = pauVar20;
      }
      else {
        pauVar15 = *(undefined1 (**) [16])((long)msp + uVar12 * 0x10 + 0x48);
      }
      *(undefined1 (**) [16])((long)msp + uVar12 * 0x10 + 0x48) = pauVar5;
      *(undefined1 (**) [16])(pauVar15[1] + 8) = pauVar5;
      lVar13 = 0x18;
      lVar24 = 0x10;
    }
    else {
      uVar17 = (uint)(uVar12 >> 8);
      if (uVar17 == 0) {
        uVar21 = 0;
      }
      else {
        uVar21 = 0x1f;
        if (uVar17 < 0x10000) {
          uVar18 = 0x1f;
          if (uVar17 != 0) {
            for (; uVar17 >> uVar18 == 0; uVar18 = uVar18 - 1) {
            }
          }
          uVar21 = (ulong)((uint)((uVar12 >> ((ulong)(byte)(0x26 - (char)(uVar18 ^ 0x1f)) & 0x3f) &
                                  1) != 0) | (uVar18 ^ 0x1f) * 2 ^ 0x3e);
        }
      }
      puVar25 = (undefined8 *)((long)msp + uVar21 * 8 + 0x248);
      *(ulong *)(pauVar5[3] + 8) = uVar21;
      pauVar5[2] = (undefined1  [16])0x0;
      if ((*(uint *)((long)msp + 4) >> ((uint)uVar21 & 0x1f) & 1) == 0) {
        *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar21 & 0x1f);
        *puVar25 = pauVar5;
        *(undefined8 **)pauVar5[3] = puVar25;
      }
      else {
        bVar27 = 0x39 - (char)(uVar21 >> 1);
        if (uVar21 == 0x1f) {
          bVar27 = 0;
        }
        lVar13 = uVar12 << (bVar27 & 0x3f);
        pauVar20 = (undefined1 (*) [16])*puVar25;
        do {
          pauVar15 = pauVar20;
          if ((*(ulong *)(*pauVar15 + 8) & 0xfffffffffffffffc) == uVar12) {
            lVar13 = *(long *)pauVar15[1];
            *(undefined1 (**) [16])(lVar13 + 0x18) = pauVar5;
            *(undefined1 (**) [16])pauVar15[1] = pauVar5;
            *(long *)pauVar5[1] = lVar13;
            lVar13 = 0x30;
            lVar24 = 0x18;
            pauVar20 = (undefined1 (*) [16])0x0;
            goto LAB_00142271;
          }
          lVar24 = lVar13 >> 0x3f;
          lVar13 = lVar13 * 2;
          pauVar20 = *(undefined1 (**) [16])((long)pauVar15 + lVar24 * -8 + 0x20);
        } while (pauVar20 != (undefined1 (*) [16])0x0);
        *(undefined1 (**) [16])((long)pauVar15 + lVar24 * -8 + 0x20) = pauVar5;
        *(undefined1 (**) [16])pauVar5[3] = pauVar15;
      }
      lVar13 = 0x10;
      lVar24 = 0x18;
      pauVar15 = pauVar5;
      pauVar20 = pauVar5;
    }
LAB_00142271:
    *(undefined1 (**) [16])(*pauVar5 + lVar24) = pauVar15;
    *(undefined1 (**) [16])(*pauVar5 + lVar13) = pauVar20;
  }
LAB_00142279:
  uVar12 = *(ulong *)((long)msp + 0x10) - uVar16;
  if (*(ulong *)((long)msp + 0x10) < uVar16 || uVar12 == 0) {
    return (void *)0x0;
  }
LAB_00141a1d:
  *(ulong *)((long)msp + 0x10) = uVar12;
  lVar24 = *(long *)((long)msp + 0x20);
  *(ulong *)((long)msp + 0x20) = lVar24 + uVar16;
  *(ulong *)(lVar24 + 8 + uVar16) = uVar12 | 1;
  *(ulong *)(lVar24 + 8) = uVar16 | 3;
LAB_00141b16:
  return (void *)(lVar24 + 0x10);
}

Assistant:

static LJ_NOINLINE void *lj_alloc_malloc(void *msp, size_t nsize)
{
  mstate ms = (mstate)msp;
  void *mem;
  size_t nb;
  if (nsize <= MAX_SMALL_REQUEST) {
    bindex_t idx;
    binmap_t smallbits;
    nb = (nsize < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(nsize);
    idx = small_index(nb);
    smallbits = ms->smallmap >> idx;

    if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
      mchunkptr b, p;
      idx += ~smallbits & 1;       /* Uses next bin if idx empty */
      b = smallbin_at(ms, idx);
      p = b->fd;
      unlink_first_small_chunk(ms, b, p, idx);
      set_inuse_and_pinuse(ms, p, small_index2size(idx));
      mem = chunk2mem(p);
      return mem;
    } else if (nb > ms->dvsize) {
      if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
	mchunkptr b, p, r;
	size_t rsize;
	binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
	bindex_t i = lj_ffs(leftbits);
	b = smallbin_at(ms, i);
	p = b->fd;
	unlink_first_small_chunk(ms, b, p, i);
	rsize = small_index2size(i) - nb;
	/* Fit here cannot be remainderless if 4byte sizes */
	if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE) {
	  set_inuse_and_pinuse(ms, p, small_index2size(i));
	} else {
	  set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
	  r = chunk_plus_offset(p, nb);
	  set_size_and_pinuse_of_free_chunk(r, rsize);
	  replace_dv(ms, r, rsize);
	}
	mem = chunk2mem(p);
	return mem;
      } else if (ms->treemap != 0 && (mem = tmalloc_small(ms, nb)) != 0) {
	return mem;
      }
    }
  } else if (nsize >= MAX_REQUEST) {
    nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
  } else {
    nb = pad_request(nsize);
    if (ms->treemap != 0 && (mem = tmalloc_large(ms, nb)) != 0) {
      return mem;
    }
  }

  if (nb <= ms->dvsize) {
    size_t rsize = ms->dvsize - nb;
    mchunkptr p = ms->dv;
    if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
      mchunkptr r = ms->dv = chunk_plus_offset(p, nb);
      ms->dvsize = rsize;
      set_size_and_pinuse_of_free_chunk(r, rsize);
      set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
    } else { /* exhaust dv */
      size_t dvs = ms->dvsize;
      ms->dvsize = 0;
      ms->dv = 0;
      set_inuse_and_pinuse(ms, p, dvs);
    }
    mem = chunk2mem(p);
    return mem;
  } else if (nb < ms->topsize) { /* Split top */
    size_t rsize = ms->topsize -= nb;
    mchunkptr p = ms->top;
    mchunkptr r = ms->top = chunk_plus_offset(p, nb);
    r->head = rsize | PINUSE_BIT;
    set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
    mem = chunk2mem(p);
    return mem;
  }
  return alloc_sys(ms, nb);
}